

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

int Sbd_ManCutCollect_rec
              (Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,int LevStop,Vec_Int_t *vLutLevs,
              Vec_Int_t *vCut)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint Entry;
  
  if ((-1 < iObj) && (iObj < vMirrors->nSize)) {
    Entry = (uint)vMirrors->pArray[(uint)iObj] >> 1;
    if (vMirrors->pArray[(uint)iObj] < 0) {
      Entry = iObj;
    }
    bVar2 = true;
    if (Entry != 0) {
      if (p->nTravIdsAlloc <= (int)Entry) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[Entry] != p->nTravIds) {
        p->pTravIds[Entry] = p->nTravIds;
        if (p->nObjs <= (int)Entry) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar1 = p->pObjs;
        uVar3 = (uint)*(undefined8 *)(pGVar1 + Entry);
        if ((~uVar3 & 0x9fffffff) != 0) {
          if (vLutLevs->nSize <= (int)Entry) goto LAB_00546ff4;
          if (LevStop < vLutLevs->pArray[Entry]) {
            if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                            ,0xf9,
                            "int Sbd_ManCutCollect_rec(Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar4 = Sbd_ManCutCollect_rec
                              (p,vMirrors,Entry - (uVar3 & 0x1fffffff),LevStop,vLutLevs,vCut);
            iVar5 = Sbd_ManCutCollect_rec
                              (p,vMirrors,Entry - (*(uint *)&pGVar1[Entry].field_0x4 & 0x1fffffff),
                               LevStop,vLutLevs,vCut);
            bVar2 = iVar5 != 0 && iVar4 != 0;
            goto LAB_00546fe2;
          }
        }
        Vec_IntPush(vCut,Entry);
        if (vLutLevs->nSize <= (int)Entry) goto LAB_00546ff4;
        bVar2 = vLutLevs->pArray[Entry] <= LevStop;
      }
    }
LAB_00546fe2:
    return (int)bVar2;
  }
LAB_00546ff4:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManCutCollect_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, int LevStop, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) || Vec_IntEntry(vLutLevs, iObj) <= LevStop )
    {
        Vec_IntPush( vCut, iObj );
        return Vec_IntEntry(vLutLevs, iObj) <= LevStop;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj), LevStop, vLutLevs, vCut );
    Ret1 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj), LevStop, vLutLevs, vCut );
    return Ret0 && Ret1;
}